

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.cpp
# Opt level: O3

int __thiscall Bstrlib::CBString::nfindchr(CBString *this,char *s,int pos)

{
  int iVar1;
  size_t sVar2;
  CBStringException *this_00;
  CBStringException bstr__cppwrapper_exception;
  tagbstring t;
  string local_70;
  CBStringException local_50;
  tagbstring local_28;
  
  if (s != (char *)0x0) {
    local_28.data = (uchar *)s;
    sVar2 = strlen(s);
    local_28.slen = (int)sVar2;
    local_28.mlen = -1;
    iVar1 = bninchr(&this->super_tagbstring,pos,&local_28);
    return iVar1;
  }
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_70,"CBString::CBString::nfindchr NULL.","");
  CBStringException::CBStringException(&local_50,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  this_00 = (CBStringException *)__cxa_allocate_exception(0x28);
  CBStringException::CBStringException(this_00,&local_50);
  __cxa_throw(this_00,&CBStringException::typeinfo,CBStringException::~CBStringException);
}

Assistant:

int CBString::nfindchr (const char * s, int pos) const {
struct tagbstring t;
	if (NULL == s) {
#ifdef BSTRLIB_THROWS_EXCEPTIONS
		bstringThrow ("CBString::nfindchr NULL.");
#else
		return BSTR_ERR;
#endif
	}
	cstr2tbstr (t, s);
	return bninchr ((bstring) this, pos, &t);
}